

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O1

void __thiscall QtMWidgets::ToolButton::paintEvent(ToolButton *this,QPaintEvent *param_1)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  undefined1 auVar6 [16];
  QPainter p;
  QPixmap pixmap;
  undefined1 auStack_88 [8];
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  QRectF local_60;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  QAction::icon();
  cVar1 = QIcon::isNull();
  QIcon::~QIcon((QIcon *)&local_80);
  if (cVar1 == '\0') {
    QAction::icon();
    QIcon::pixmap(&local_60,&local_80,&((this->d).d)->iconSize,0,1);
    QIcon::~QIcon((QIcon *)&local_80);
    auVar6 = QWidget::contentsRect();
    uVar3 = QPixmap::size();
    QPainter::QPainter((QPainter *)auStack_88,(QPaintDevice *)&this->field_0x10);
    iVar4 = (auVar6._8_4_ - auVar6._0_4_) - (int)uVar3;
    iVar2 = (int)((ulong)uVar3 >> 0x20);
    iVar5 = (auVar6._12_4_ - auVar6._4_4_) - iVar2;
    local_80 = (double)(((iVar4 - (iVar4 + 1 >> 0x1f)) + 1 >> 1) + auVar6._0_4_);
    local_78 = (double)(((iVar5 - (iVar5 + 1 >> 0x1f)) + 1 >> 1) + auVar6._4_4_);
    local_70 = (double)(int)uVar3;
    local_68 = (double)iVar2;
    local_38 = 0;
    uStack_30 = 0;
    local_60.h = 0.0;
    uStack_40 = 0;
    QPainter::drawPixmap((QRectF *)auStack_88,(QPixmap *)&local_80,&local_60);
    QPainter::~QPainter((QPainter *)auStack_88);
    QPixmap::~QPixmap((QPixmap *)&local_60);
  }
  return;
}

Assistant:

void
ToolButton::paintEvent( QPaintEvent * )
{
	if( !d->action->icon().isNull() )
	{
		const QPixmap pixmap = d->action->icon().pixmap( d->iconSize );
		const QRect r = contentsRect();
		const QSize s = pixmap.size();

		QPainter p( this );

		p.drawPixmap( r.left() + ( r.width() - s.width() ) / 2,
			r.top() + ( r.height() - s.height() ) / 2,
			s.width(), s.height(), pixmap );
	}
}